

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgba64 * qt_fetch_conical_gradient_rgb64
                    (QRgba64 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  QRgba64 *pQVar1;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  QSpanData *in_stack_00000040;
  QRgba64 *in_stack_00000048;
  
  pQVar1 = qt_fetch_conical_gradient_template<GradientBase64,QRgba64>
                     (in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000038,
                      in_stack_00000034);
  return pQVar1;
}

Assistant:

static const QRgba64 * QT_FASTCALL qt_fetch_conical_gradient_rgb64(QRgba64 *buffer, const Operator *, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_conical_gradient_template<GradientBase64, QRgba64>(buffer, data, y, x, length);
}